

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateKernelDecl(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op opcode;
  uint uVar2;
  uint uVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_5c0;
  NonSemanticClspvReflectionInstructions local_3e4;
  undefined1 local_3e0 [4];
  NonSemanticClspvReflectionInstructions ext_inst;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *decl;
  Instruction *pIStack_20;
  uint decl_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  decl._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,4);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,decl._4_4_);
  if (local_30 != (Instruction *)0x0) {
    opcode = Instruction::opcode(local_30);
    bVar1 = spvIsExtendedInstruction(opcode);
    if (bVar1) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(local_30,2);
      uVar3 = Instruction::GetOperandAs<unsigned_int>(pIStack_20,2);
      if (uVar2 != uVar3) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_3e0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_3e0,
                            (char (*) [57])
                            "Kernel must be from the same extended instruction import");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e0);
        return __local._4_4_;
      }
      local_3e4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(local_30,3);
      if (local_3e4 != NonSemanticClspvReflectionKernel) {
        ValidationState_t::diag
                  (&local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_5c0,(char (*) [45])"Kernel must be a Kernel extended instruction"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_5c0);
        return __local._4_4_;
      }
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar4 = DiagnosticStream::operator<<
                     (&local_208,(char (*) [45])"Kernel must be a Kernel extended instruction");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateKernelDecl(ValidationState_t& _, const Instruction* inst) {
  const auto decl_id = inst->GetOperandAs<uint32_t>(4);
  const auto decl = _.FindDef(decl_id);
  if (!decl || !spvIsExtendedInstruction(decl->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  if (decl->GetOperandAs<uint32_t>(2) != inst->GetOperandAs<uint32_t>(2)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be from the same extended instruction import";
  }

  const auto ext_inst =
      decl->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  if (ext_inst != NonSemanticClspvReflectionKernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  return SPV_SUCCESS;
}